

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.h
# Opt level: O3

Numeral * __thiscall
viras::
Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
::add(Numeral *__return_storage_ptr__,
     Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
     *this,Numeral *l,Numeral *r)

{
  RationalConstantType local_60;
  RationalConstantType local_40;
  
  Kernel::IntegerConstantType::IntegerConstantType(&local_40._num,&l->_num);
  Kernel::IntegerConstantType::IntegerConstantType(&local_40._den,&l->_den);
  Kernel::IntegerConstantType::IntegerConstantType(&local_60._num,&r->_num);
  Kernel::IntegerConstantType::IntegerConstantType(&local_60._den,&r->_den);
  Kernel::RationalConstantType::operator+(__return_storage_ptr__,&local_40,&local_60);
  mpz_clear(local_60._den._val);
  mpz_clear((__mpz_struct *)&local_60);
  mpz_clear(local_40._den._val);
  mpz_clear((__mpz_struct *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Numeral add(Numeral l, Numeral r) { return api.add(l,r); }